

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

CURLcode Curl_loadhostpairs(SessionHandle *data)

{
  curl_slist *pcVar1;
  int iVar2;
  Curl_addrinfo *addr;
  char *pcVar3;
  size_t sVar4;
  void *pvVar5;
  Curl_dns_entry *pCVar6;
  curl_slist **ppcVar7;
  bool bVar8;
  int port;
  curl_slist **local_240;
  char address [256];
  char hostname [256];
  
  ppcVar7 = &(data->change).resolve;
  local_240 = ppcVar7;
  do {
    pcVar1 = *ppcVar7;
    if (pcVar1 == (curl_slist *)0x0) {
      *local_240 = (curl_slist *)0x0;
      return CURLE_OK;
    }
    pcVar3 = pcVar1->data;
    if (((pcVar3 != (char *)0x0) && (*pcVar3 != '-')) &&
       (iVar2 = __isoc99_sscanf(pcVar3,"%255[^:]:%d:%255s",hostname,&port,address), iVar2 == 3)) {
      addr = Curl_str2addr(address,port);
      if (addr == (Curl_addrinfo *)0x0) {
        Curl_infof(data,"Resolve %s found illegal!\n",pcVar1->data);
      }
      else {
        pcVar3 = create_hostcache_id(hostname,port);
        if (pcVar3 == (char *)0x0) {
LAB_00429cec:
          Curl_freeaddrinfo(addr);
          return CURLE_OUT_OF_MEMORY;
        }
        sVar4 = strlen(pcVar3);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
        }
        pvVar5 = Curl_hash_pick((data->dns).hostcache,pcVar3,sVar4 + 1);
        (*Curl_cfree)(pcVar3);
        if (pvVar5 == (void *)0x0) {
          pCVar6 = Curl_cache_addr(data,addr,hostname,port);
          bVar8 = pCVar6 == (Curl_dns_entry *)0x0;
        }
        else {
          Curl_freeaddrinfo(addr);
          bVar8 = false;
        }
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
        }
        if (bVar8) goto LAB_00429cec;
        Curl_infof(data,"Added %s:%d:%s to DNS cache\n",hostname,(ulong)(uint)port,address);
      }
    }
    ppcVar7 = &pcVar1->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct SessionHandle *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  char address[256];
  int port;

  for(hostp = data->change.resolve; hostp; hostp = hostp->next ) {
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      /* TODO: mark an entry for removal */
    }
    else if(3 == sscanf(hostp->data, "%255[^:]:%d:%255s", hostname, &port,
                        address)) {
      struct Curl_dns_entry *dns;
      Curl_addrinfo *addr;
      char *entry_id;
      size_t entry_len;

      addr = Curl_str2addr(address, port);
      if(!addr) {
        infof(data, "Resolve %s found illegal!\n", hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        Curl_freeaddrinfo(addr);
        return CURLE_OUT_OF_MEMORY;
      }

      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if its already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len+1);

      /* free the allocated entry_id again */
      free(entry_id);

      if(!dns)
        /* if not in the cache already, put this host in the cache */
        dns = Curl_cache_addr(data, addr, hostname, port);
      else
        /* this is a duplicate, free it again */
        Curl_freeaddrinfo(addr);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(addr);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache\n",
            hostname, port, address);
    }
  }
  data->change.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}